

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int Android420ToARGBMatrix
              (uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
              int src_stride_v,int src_pixel_stride_uv,uint8_t *dst_argb,int dst_stride_argb,
              YuvConstants *yuvconstants,int width,int height)

{
  int width_00;
  uint8_t *src_y_00;
  YuvConstants *pYVar1;
  int in_ECX;
  uint8_t *in_RDX;
  long in_RDI;
  YuvConstants *in_R8;
  int in_R9D;
  int in_stack_00000008;
  long in_stack_00000010;
  uint8_t *in_stack_00000020;
  uint8_t *plane_uv;
  uint8_t *plane_uv_mem;
  int halfheight;
  int halfwidth;
  ptrdiff_t vu_off;
  uint8_t *dst_uv;
  int y;
  int in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar2;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  int local_60;
  YuvConstants *in_stack_ffffffffffffffb0;
  YuvConstants *yuvconstants_00;
  int in_stack_ffffffffffffffb8;
  int iVar3;
  int in_stack_ffffffffffffffc8;
  int local_14;
  
  width_00 = (int)plane_uv + 1 >> 1;
  local_60 = (int)plane_uv_mem + 1;
  if ((((in_RDI == 0) || (in_RDX == (uint8_t *)0x0)) || (in_R8 == (YuvConstants *)0x0)) ||
     (((in_stack_00000010 == 0 || ((int)plane_uv < 1)) || ((int)plane_uv_mem == 0)))) {
    local_14 = -1;
  }
  else {
    if ((int)plane_uv_mem < 0) {
      plane_uv_mem._0_4_ = -(int)plane_uv_mem;
      local_60 = (int)plane_uv_mem + 1;
    }
    local_60 = local_60 >> 1;
    iVar3 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    if (in_stack_00000008 == 1) {
      local_14 = I420ToARGBMatrix(in_stack_ffffffffffffff98,iVar3,
                                  (uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,(int)plane_uv_mem),
                                  in_stack_ffffffffffffff84,in_stack_00000020,
                                  in_stack_ffffffffffffff74,(uint8_t *)in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffb8,in_R8,in_stack_ffffffffffffffc8,
                                  (int)in_RDX);
    }
    else {
      uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (((in_stack_00000008 == 2) && ((long)in_R8 - (long)in_RDX == -1)) && (in_ECX == in_R9D)) {
        local_14 = NV21ToARGBMatrix(in_stack_ffffffffffffff98,iVar3,
                                    (uint8_t *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                    in_stack_ffffffffffffff84,
                                    (uint8_t *)CONCAT44(uVar2,(int)plane_uv_mem),
                                    in_stack_ffffffffffffff74,in_stack_ffffffffffffffb0,
                                    in_stack_ffffffffffffffb8,(int)in_R8);
      }
      else if (((in_stack_00000008 == 2) && ((long)in_R8 - (long)in_RDX == 1)) && (in_ECX == in_R9D)
              ) {
        local_14 = NV12ToARGBMatrix(in_stack_ffffffffffffff98,iVar3,
                                    (uint8_t *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                    in_stack_ffffffffffffff84,
                                    (uint8_t *)CONCAT44(uVar2,(int)plane_uv_mem),
                                    in_stack_ffffffffffffff74,in_stack_ffffffffffffffb0,
                                    in_stack_ffffffffffffffb8,(int)in_R8);
      }
      else {
        src_y_00 = (uint8_t *)malloc((long)(width_00 * 2 * local_60 + 0x3f));
        pYVar1 = (YuvConstants *)((ulong)(src_y_00 + 0x3f) & 0xffffffffffffffc0);
        yuvconstants_00 = pYVar1;
        for (iVar3 = 0; iVar3 < local_60; iVar3 = iVar3 + 1) {
          libyuv::WeavePixels(in_RDX,(uint8_t *)in_R8,in_stack_00000008,(uint8_t *)yuvconstants_00,
                              width_00);
          in_RDX = in_RDX + in_ECX;
          in_R8 = (YuvConstants *)(in_R8->kUVToB + in_R9D);
          yuvconstants_00 = (YuvConstants *)(yuvconstants_00->kUVToB + (width_00 << 1));
        }
        NV12ToARGBMatrix(src_y_00,(int)((ulong)pYVar1 >> 0x20),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84,
                         (uint8_t *)
                         CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)plane_uv_mem)
                         ,in_stack_ffffffffffffff74,yuvconstants_00,iVar3,(int)in_R8);
        free(src_y_00);
        local_14 = 0;
      }
    }
  }
  return local_14;
}

Assistant:

LIBYUV_API
int Android420ToARGBMatrix(const uint8_t* src_y,
                           int src_stride_y,
                           const uint8_t* src_u,
                           int src_stride_u,
                           const uint8_t* src_v,
                           int src_stride_v,
                           int src_pixel_stride_uv,
                           uint8_t* dst_argb,
                           int dst_stride_argb,
                           const struct YuvConstants* yuvconstants,
                           int width,
                           int height) {
  int y;
  uint8_t* dst_uv;
  const ptrdiff_t vu_off = src_v - src_u;
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src_y || !src_u || !src_v || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }

  // I420
  if (src_pixel_stride_uv == 1) {
    return I420ToARGBMatrix(src_y, src_stride_y, src_u, src_stride_u, src_v,
                            src_stride_v, dst_argb, dst_stride_argb,
                            yuvconstants, width, height);
    // NV21
  }
  if (src_pixel_stride_uv == 2 && vu_off == -1 &&
      src_stride_u == src_stride_v) {
    return NV21ToARGBMatrix(src_y, src_stride_y, src_v, src_stride_v, dst_argb,
                            dst_stride_argb, yuvconstants, width, height);
    // NV12
  }
  if (src_pixel_stride_uv == 2 && vu_off == 1 && src_stride_u == src_stride_v) {
    return NV12ToARGBMatrix(src_y, src_stride_y, src_u, src_stride_u, dst_argb,
                            dst_stride_argb, yuvconstants, width, height);
  }

  // General case fallback creates NV12
  align_buffer_64(plane_uv, halfwidth * 2 * halfheight);
  dst_uv = plane_uv;
  for (y = 0; y < halfheight; ++y) {
    WeavePixels(src_u, src_v, src_pixel_stride_uv, dst_uv, halfwidth);
    src_u += src_stride_u;
    src_v += src_stride_v;
    dst_uv += halfwidth * 2;
  }
  NV12ToARGBMatrix(src_y, src_stride_y, plane_uv, halfwidth * 2, dst_argb,
                   dst_stride_argb, yuvconstants, width, height);
  free_aligned_buffer_64(plane_uv);
  return 0;
}